

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportTryCompileFileGenerator::cmExportTryCompileFileGenerator
          (cmExportTryCompileFileGenerator *this,cmGlobalGenerator *gg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,cmMakefile *mf)

{
  cmMakefile *mf_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targets_local;
  cmGlobalGenerator *gg_local;
  cmExportTryCompileFileGenerator *this_local;
  
  cmExportFileGenerator::cmExportFileGenerator(&this->super_cmExportFileGenerator);
  (this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator =
       (_func_int **)&PTR__cmExportTryCompileFileGenerator_00bc7e88;
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector
            (&this->Exports);
  std::__cxx11::string::string((string *)&this->Config);
  cmGlobalGenerator::CreateImportedGenerationObjects(gg,mf,targets,&this->Exports);
  return;
}

Assistant:

cmExportTryCompileFileGenerator::cmExportTryCompileFileGenerator(
  cmGlobalGenerator* gg, const std::vector<std::string>& targets,
  cmMakefile* mf)
{
  gg->CreateImportedGenerationObjects(mf, targets, this->Exports);
}